

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O3

EntryType * __thiscall
google::protobuf::internal::
MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::NewEntry(MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *this)

{
  Arena *this_00;
  EntryType *pEVar1;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    pEVar1 = (EntryType *)operator_new(0x30);
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).default_instance_ =
         (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
          *)0x0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).key_ = 0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).value_ = 0.0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).arena_ = (Arena *)0x0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    )._has_bits_[0] = 0;
  }
  else {
    pEVar1 = (EntryType *)
             Arena::AllocateAligned
                       (this_00,(type_info *)
                                &MapEntryLite<long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>
                                 ::typeinfo,0x30);
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).default_instance_ =
         (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
          *)0x0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).arena_ = this_00;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    )._has_bits_[0] = 0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).key_ = 0;
    (pEVar1->
    super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ).value_ = 0.0;
  }
  (pEVar1->
  super_MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  ).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__MapEntryImpl_006fc9d8;
  return pEVar1;
}

Assistant:

EntryType* NewEntry() const {
    if (arena_ == NULL) {
      return new EntryType();
    } else {
      return Arena::CreateMessage<EntryType>(arena_);
    }
  }